

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

string * __thiscall
slang::CommandLine::Option::set_abi_cxx11_
          (string *__return_storage_ptr__,Option *this,vector<long,_std::allocator<long>_> *target,
          string_view name,string_view value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator __position;
  pointer p;
  string_view *psVar2;
  string_view *psVar3;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL> sVar4;
  optional<long> oVar5;
  string_view sVar6;
  SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> splitMem;
  _Storage<long,_true> local_78;
  undefined1 local_70;
  undefined1 *local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined1 local_50 [32];
  
  local_68 = local_50;
  local_60 = 0;
  local_58 = 2;
  sVar6._M_str._0_4_ = ((this->flags).m_bits & 2) >> 1;
  sVar6._M_len = (size_t)value._M_str;
  sVar6._M_str._4_4_ = 0;
  sVar4 = parseList((slang *)value._M_len,sVar6,SUB81(&local_68,0),
                    (SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> *)
                    name._M_str);
  psVar2 = sVar4._M_ptr;
  if (sVar4._M_extent._M_extent_value._M_extent_value != 0) {
    psVar3 = psVar2 + sVar4._M_extent._M_extent_value._M_extent_value;
    paVar1 = &__return_storage_ptr__->field_2;
    do {
      sVar6 = *psVar2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      oVar5 = parseInt<long>(name,sVar6,__return_storage_ptr__);
      local_78._M_value =
           oVar5.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
      local_70 = oVar5.super__Optional_base<long,_true,_true>._M_payload.
                 super__Optional_payload_base<long>._M_engaged;
      if (((undefined1  [16])
           oVar5.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) == (undefined1  [16])0x0)
      goto LAB_002a2b30;
      __position._M_current = *(long **)(target + 8);
      if (__position._M_current == *(long **)(target + 0x10)) {
        std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                  ((vector<long,std::allocator<long>> *)target,__position,&local_78._M_value);
      }
      else {
        *__position._M_current = (long)local_78;
        *(long **)(target + 8) = __position._M_current + 1;
      }
      p = (__return_storage_ptr__->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)p != paVar1) {
        operator_delete(p,paVar1->_M_allocated_capacity + 1);
      }
      psVar2 = psVar2 + 1;
    } while (psVar2 != psVar3);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_002a2b30:
  if (local_68 != local_50) {
    operator_delete(local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CommandLine::Option::set(std::vector<int64_t>& target, std::string_view name,
                                     std::string_view value) {
    return setIntList(target, name, value, flags);
}